

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)200>(Result *__return_storage_ptr__,Model *pipeline)

{
  PipelineClassifier *this;
  Pipeline *pipelineParams_00;
  Pipeline *pipelineParams;
  Model *pipeline_local;
  
  this = Specification::Model::pipelineclassifier(pipeline);
  pipelineParams_00 = Specification::PipelineClassifier::pipeline(this);
  validate(__return_storage_ptr__,pipeline,pipelineParams_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipelineClassifier>(const Specification::Model& pipeline) {
        const auto& pipelineParams = pipeline.pipelineclassifier().pipeline();
        // TODO -- validate classifier interface
        return validate(pipeline, pipelineParams);
    }